

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_uint32 mz_zip_writer_create_zip64_extra_data
                    (mz_uint8 *pBuf,mz_uint64 *pUncomp_size,mz_uint64 *pComp_size,
                    mz_uint64 *pLocal_header_ofs)

{
  mz_uint64 mVar1;
  mz_uint8 mVar2;
  mz_uint8 *pmStack_f0;
  mz_uint32 field_size;
  mz_uint8 *pDst;
  mz_uint64 *pLocal_header_ofs_local;
  mz_uint64 *pComp_size_local;
  mz_uint64 *pUncomp_size_local;
  mz_uint8 *pBuf_local;
  
  mVar2 = '\0';
  *pBuf = '\x01';
  pBuf[1] = '\0';
  pBuf[2] = '\0';
  pBuf[3] = '\0';
  pmStack_f0 = pBuf + 4;
  if (pUncomp_size != (mz_uint64 *)0x0) {
    mVar1 = *pUncomp_size;
    *pmStack_f0 = (mz_uint8)mVar1;
    pBuf[5] = (mz_uint8)(mVar1 >> 8);
    pBuf[6] = (mz_uint8)(mVar1 >> 0x10);
    pBuf[7] = (mz_uint8)(mVar1 >> 0x18);
    pBuf[8] = (mz_uint8)(mVar1 >> 0x20);
    pBuf[9] = (mz_uint8)(mVar1 >> 0x28);
    pBuf[10] = (mz_uint8)(mVar1 >> 0x30);
    pBuf[0xb] = (mz_uint8)(mVar1 >> 0x38);
    pmStack_f0 = pBuf + 0xc;
    mVar2 = '\b';
  }
  if (pComp_size != (mz_uint64 *)0x0) {
    mVar1 = *pComp_size;
    *pmStack_f0 = (mz_uint8)mVar1;
    pmStack_f0[1] = (mz_uint8)(mVar1 >> 8);
    pmStack_f0[2] = (mz_uint8)(mVar1 >> 0x10);
    pmStack_f0[3] = (mz_uint8)(mVar1 >> 0x18);
    pmStack_f0[4] = (mz_uint8)(mVar1 >> 0x20);
    pmStack_f0[5] = (mz_uint8)(mVar1 >> 0x28);
    pmStack_f0[6] = (mz_uint8)(mVar1 >> 0x30);
    pmStack_f0[7] = (mz_uint8)(mVar1 >> 0x38);
    pmStack_f0 = pmStack_f0 + 8;
    mVar2 = mVar2 + '\b';
  }
  if (pLocal_header_ofs != (mz_uint64 *)0x0) {
    mVar1 = *pLocal_header_ofs;
    *pmStack_f0 = (mz_uint8)mVar1;
    pmStack_f0[1] = (mz_uint8)(mVar1 >> 8);
    pmStack_f0[2] = (mz_uint8)(mVar1 >> 0x10);
    pmStack_f0[3] = (mz_uint8)(mVar1 >> 0x18);
    pmStack_f0[4] = (mz_uint8)(mVar1 >> 0x20);
    pmStack_f0[5] = (mz_uint8)(mVar1 >> 0x28);
    pmStack_f0[6] = (mz_uint8)(mVar1 >> 0x30);
    pmStack_f0[7] = (mz_uint8)(mVar1 >> 0x38);
    pmStack_f0 = pmStack_f0 + 8;
    mVar2 = mVar2 + '\b';
  }
  pBuf[2] = mVar2;
  pBuf[3] = '\0';
  return (int)pmStack_f0 - (int)pBuf;
}

Assistant:

static mz_uint32 mz_zip_writer_create_zip64_extra_data(mz_uint8 *pBuf, mz_uint64 *pUncomp_size, mz_uint64 *pComp_size, mz_uint64 *pLocal_header_ofs)
{
    mz_uint8 *pDst = pBuf;
    mz_uint32 field_size = 0;

    MZ_WRITE_LE16(pDst + 0, MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID);
    MZ_WRITE_LE16(pDst + 2, 0);
    pDst += sizeof(mz_uint16) * 2;

    if (pUncomp_size)
    {
        MZ_WRITE_LE64(pDst, *pUncomp_size);
        pDst += sizeof(mz_uint64);
        field_size += sizeof(mz_uint64);
    }

    if (pComp_size)
    {
        MZ_WRITE_LE64(pDst, *pComp_size);
        pDst += sizeof(mz_uint64);
        field_size += sizeof(mz_uint64);
    }

    if (pLocal_header_ofs)
    {
        MZ_WRITE_LE64(pDst, *pLocal_header_ofs);
        pDst += sizeof(mz_uint64);
        field_size += sizeof(mz_uint64);
    }

    MZ_WRITE_LE16(pBuf + 2, field_size);

    return (mz_uint32)(pDst - pBuf);
}